

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QSimpleParsedNumber<unsigned_long_long> __thiscall
QLocaleData::stringToUnsLongLong
          (QLocaleData *this,QStringView str,int base,NumberOptions number_options)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView num;
  QSimpleParsedNumber<unsigned_long_long> QVar2;
  CharBuff local_150;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_150.super_QVLAStorage<1UL,_1UL,_256LL>,0xaa,0x100);
  local_150.super_QVLABase<char>.super_QVLABaseBase.a = 0x100;
  local_150.super_QVLABase<char>.super_QVLABaseBase.s = 0;
  local_150.super_QVLABase<char>.super_QVLABaseBase.ptr =
       &local_150.super_QVLAStorage<1UL,_1UL,_256LL>;
  bVar1 = numberToCLocale(this,str,number_options,IntegerMode,&local_150);
  if (bVar1) {
    num.m_data._0_4_ = base;
    num.m_size = (qsizetype)local_150.super_QVLABase<char>.super_QVLABaseBase.ptr;
    num.m_data._4_4_ = 0;
    QVar2 = bytearrayToUnsLongLong
                      ((QLocaleData *)local_150.super_QVLABase<char>.super_QVLABaseBase.s,num,
                       (int)number_options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                            super_QFlagsStorage<QLocale::NumberOption>.i);
  }
  else {
    QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
  }
  QVarLengthArray<char,_256LL>::~QVarLengthArray(&local_150);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSimpleParsedNumber<quint64>
QLocaleData::stringToUnsLongLong(QStringView str, int base,
                                 QLocale::NumberOptions number_options) const
{
    CharBuff buff;
    if (!numberToCLocale(str, number_options, IntegerMode, &buff))
        return {};

    return bytearrayToUnsLongLong(QByteArrayView(buff), base);
}